

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::SequenceFeatureType::MergePartialFromCodedStream
          (SequenceFeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  Int64FeatureType *this_00;
  StringFeatureType *this_01;
  SizeRange *this_02;
  pair<int,_int> pVar9;
  char cVar10;
  Limit limit;
  ulong uVar11;
  CodedInputStream *pCVar12;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_00445d02;
        uVar11 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_00445d02:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar8 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) {
LAB_00445b20:
      if (uVar8 == 0) {
        return true;
      }
      if ((uVar8 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
    }
    else {
      uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar10 = (char)uVar11;
      if (uVar6 != 0x65) {
        if (uVar6 == 3) {
          if (cVar10 == '\x1a') {
            if (this->_oneof_case_[0] != 3) {
              clear_Type(this);
              this->_oneof_case_[0] = 3;
              this_01 = (StringFeatureType *)operator_new(0x18);
              StringFeatureType::StringFeatureType(this_01);
              (this->Type_).stringtype_ = this_01;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pCVar12 = input;
            pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar9 < 0) {
              return false;
            }
            bVar5 = StringFeatureType::MergePartialFromCodedStream
                              ((StringFeatureType *)pCVar12,input);
LAB_00445cee:
            if (bVar5 == false) {
              return false;
            }
            limit = pVar9.first;
            goto LAB_00445cf8;
          }
        }
        else if ((uVar6 == 1) && (cVar10 == '\n')) {
          if (this->_oneof_case_[0] != 1) {
            clear_Type(this);
            this->_oneof_case_[0] = 1;
            this_00 = (Int64FeatureType *)operator_new(0x18);
            Int64FeatureType::Int64FeatureType(this_00);
            (this->Type_).int64type_ = this_00;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pCVar12 = input;
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar7);
          if ((long)pVar9 < 0) {
            return false;
          }
          bVar5 = Int64FeatureType::MergePartialFromCodedStream((Int64FeatureType *)pCVar12,input);
          goto LAB_00445cee;
        }
        goto LAB_00445b20;
      }
      if (cVar10 != '*') goto LAB_00445b20;
      this_02 = this->sizerange_;
      if (this_02 == (SizeRange *)0x0) {
        this_02 = (SizeRange *)operator_new(0x28);
        SizeRange::SizeRange(this_02);
        this->sizerange_ = this_02;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = SizeRange::MergePartialFromCodedStream(this_02,input);
      if (!bVar5) {
        return false;
      }
      limit = pVar9.first;
LAB_00445cf8:
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,limit);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool SequenceFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SequenceFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Int64FeatureType int64Type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringFeatureType stringType = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringtype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SizeRange sizeRange = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sizerange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SequenceFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SequenceFeatureType)
  return false;
#undef DO_
}